

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void __thiscall QPanGesture::QPanGesture(QPanGesture *this,QObject *parent)

{
  QPanGesturePrivate *pQVar1;
  QGesture *in_RSI;
  QGesturePrivate *in_RDI;
  
  pQVar1 = (QPanGesturePrivate *)operator_new(0xf0);
  QPanGesturePrivate::QPanGesturePrivate(pQVar1);
  QGesture::QGesture(in_RSI,in_RDI,(QObject *)pQVar1);
  *(undefined ***)in_RDI = &PTR_metaObject_00d06c90;
  pQVar1 = d_func((QPanGesture *)0x2fb3df);
  (pQVar1->super_QGesturePrivate).gestureType = PanGesture;
  return;
}

Assistant:

QPanGesture::QPanGesture(QObject *parent)
    : QGesture(*new QPanGesturePrivate, parent)
{
    d_func()->gestureType = Qt::PanGesture;
}